

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_bswap64_i64_tricore(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_bswap64_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_bswap64_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        TCGv_i32 t0, t1;
        t0 = tcg_temp_new_i32(tcg_ctx);
        t1 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_bswap32_i32(tcg_ctx, t0, TCGV_LOW(tcg_ctx, arg));
        tcg_gen_bswap32_i32(tcg_ctx, t1, TCGV_HIGH(tcg_ctx, arg));
        tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), t1);
        tcg_gen_mov_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), t0);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
#elif TCG_TARGET_HAS_bswap64_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_bswap64_i64, ret, arg);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

                                        /* arg = abcdefgh */
        tcg_gen_movi_i64(tcg_ctx, t2, 0x00ff00ff00ff00ffull);
        tcg_gen_shri_i64(tcg_ctx, t0, arg, 8);   /*  t0 = .abcdefg */
        tcg_gen_and_i64(tcg_ctx, t1, arg, t2);   /*  t1 = .b.d.f.h */
        tcg_gen_and_i64(tcg_ctx, t0, t0, t2);    /*  t0 = .a.c.e.g */
        tcg_gen_shli_i64(tcg_ctx, t1, t1, 8);    /*  t1 = b.d.f.h. */
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);    /* ret = badcfehg */

        tcg_gen_movi_i64(tcg_ctx, t2, 0x0000ffff0000ffffull);
        tcg_gen_shri_i64(tcg_ctx, t0, ret, 16);  /*  t0 = ..badcfe */
        tcg_gen_and_i64(tcg_ctx, t1, ret, t2);   /*  t1 = ..dc..hg */
        tcg_gen_and_i64(tcg_ctx, t0, t0, t2);    /*  t0 = ..ba..fe */
        tcg_gen_shli_i64(tcg_ctx, t1, t1, 16);   /*  t1 = dc..hg.. */
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);    /* ret = dcbahgfe */

        tcg_gen_shri_i64(tcg_ctx, t0, ret, 32);  /*  t0 = ....dcba */
        tcg_gen_shli_i64(tcg_ctx, t1, ret, 32);  /*  t1 = hgfe.... */
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);    /* ret = hgfedcba */

        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
        tcg_temp_free_i64(tcg_ctx, t2);
#endif
}